

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall myEmployee::ArchiveOUT(myEmployee *this,ChArchiveOut *marchive)

{
  myEnum_mapper enum_map;
  ChEnumMapper<myEnum> local_b0;
  ChEnumMapper<myEnum> local_90;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> local_70;
  ChNameValue<double> local_58;
  ChNameValue<int> local_40;
  
  chrono::ChArchiveOut::VersionWrite<myEmployee>(marchive);
  local_40._value = &this->age;
  local_40._name = "age";
  local_40._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_40);
  local_58._value = &this->wages;
  local_58._name = "wages";
  local_58._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_58);
  myEnum_mapper::myEnum_mapper((myEnum_mapper *)&local_90);
  myEnum_mapper::operator()(&local_b0,(myEnum_mapper *)&local_90,&this->body);
  local_70._name = "body";
  local_70._flags = '\0';
  local_70._value = &local_b0;
  chrono::ChArchiveOut::operator<<(marchive,&local_70);
  chrono::ChEnumMapper<myEnum>::~ChEnumMapper(&local_b0);
  chrono::ChEnumMapper<myEnum>::~ChEnumMapper(&local_90);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployee>();
        // stream out all member data
        marchive << CHNVP(age);
        marchive << CHNVP(wages);
        myEnum_mapper enum_map;
        marchive << CHNVP(enum_map(body), "body"); // note: CHNVP macro can override names used when streaming to ascii..
    }